

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int http2_getsock(Curl_easy *data,connectdata *conn,curl_socket_t *sock)

{
  HTTP *pHVar1;
  int iVar2;
  int32_t iVar3;
  HTTP *stream;
  int bitmap;
  SingleRequest *k;
  http_conn *c;
  curl_socket_t *sock_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pHVar1 = (data->req).p.http;
  *sock = conn->sock[0];
  stream._4_4_ = (uint)(((data->req).keepon & 0x10U) == 0);
  if ((((((data->req).keepon & 0x22U) == 2) ||
       (iVar2 = nghttp2_session_want_write((conn->proto).httpc.h2), iVar2 != 0)) &&
      (iVar3 = nghttp2_session_get_remote_window_size((conn->proto).httpc.h2), iVar3 != 0)) &&
     (iVar3 = nghttp2_session_get_stream_remote_window_size
                        ((conn->proto).httpc.h2,pHVar1->stream_id), iVar3 != 0)) {
    stream._4_4_ = stream._4_4_ | 0x10000;
  }
  return stream._4_4_;
}

Assistant:

static int http2_getsock(struct Curl_easy *data,
                         struct connectdata *conn,
                         curl_socket_t *sock)
{
  const struct http_conn *c = &conn->proto.httpc;
  struct SingleRequest *k = &data->req;
  int bitmap = GETSOCK_BLANK;
  struct HTTP *stream = data->req.p.http;

  sock[0] = conn->sock[FIRSTSOCKET];

  if(!(k->keepon & KEEP_RECV_PAUSE))
    /* Unless paused - in a HTTP/2 connection we can basically always get a
       frame so we should always be ready for one */
    bitmap |= GETSOCK_READSOCK(FIRSTSOCKET);

  /* we're (still uploading OR the HTTP/2 layer wants to send data) AND
     there's a window to send data in */
  if((((k->keepon & (KEEP_SEND|KEEP_SEND_PAUSE)) == KEEP_SEND) ||
      nghttp2_session_want_write(c->h2)) &&
     (nghttp2_session_get_remote_window_size(c->h2) &&
      nghttp2_session_get_stream_remote_window_size(c->h2,
                                                    stream->stream_id)))
    bitmap |= GETSOCK_WRITESOCK(FIRSTSOCKET);

  return bitmap;
}